

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O1

int __thiscall
libchars::terminal_driver::cursor_position
          (terminal_driver *this,size_t *x,size_t *y,ssize_t timeout_ms)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  ssize_t sVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  byte bVar17;
  undefined1 auStack_68 [8];
  timeval T_start;
  undefined1 local_50 [8];
  timeval T_now;
  
  *y = 0;
  *x = 0;
  sVar5 = write(this,0x115cd4,(void *)0x4,timeout_ms);
  iVar15 = -1;
  if ((int)sVar5 == 0) {
    lVar9 = 5000;
    if (-1 < timeout_ms) {
      lVar9 = timeout_ms;
    }
    auStack_68 = (undefined1  [8])0x0;
    T_start.tv_sec = 0;
    T_now.tv_usec = (__suseconds_t)x;
    gettimeofday((timeval *)auStack_68,(__timezone_ptr_t)0x0);
    lVar6 = (long)auStack_68 * 1000;
    uVar8 = (ulong)T_start.tv_sec / 1000;
    do {
      do {
        if (this->rbuf_deq + 6 <= this->rbuf_enq) {
          sVar7 = this->rbuf_size;
          uVar1 = sVar7 - 1;
          bVar17 = 0;
          sVar3 = this->rbuf_deq;
          do {
            uVar12 = sVar3;
            uVar2 = this->rbuf_enq;
            if (uVar2 <= uVar12) break;
            if (3 < bVar17) goto LAB_00112dc1;
            uVar11 = (uint)this->rbuf[uVar12 & uVar1];
            switch(bVar17) {
            case 0:
              bVar17 = uVar11 == 0x1b;
              if ((bool)bVar17) {
                sVar7 = uVar12;
              }
              break;
            case 1:
              if (uVar11 != 0x5b) {
                sVar7 = this->rbuf_size;
              }
              bVar17 = (uVar11 == 0x5b) * '\x02';
              break;
            case 2:
              bVar17 = 3;
              if (uVar11 != 0x3b) {
                if (uVar11 - 0x30 < 10) {
                  *y = (ulong)(uVar11 - 0x30) + *y * 10;
                  bVar17 = 2;
                }
                else {
LAB_00112db8:
                  bVar17 = 0;
                  sVar7 = this->rbuf_size;
                }
              }
              break;
            case 3:
              if (uVar11 != 0x52) {
                if (9 < uVar11 - 0x30) goto LAB_00112db8;
                *(ulong *)T_now.tv_usec = (ulong)(uVar11 - 0x30) + *(long *)T_now.tv_usec * 10;
                bVar17 = 3;
                break;
              }
              uVar10 = uVar12 + 1;
              uVar14 = this->rbuf_enq;
              uVar13 = sVar7;
              if (uVar10 < uVar14) {
                do {
                  this->rbuf[uVar13 & uVar1] = this->rbuf[uVar10 & uVar1];
                  uVar10 = uVar10 + 1;
                  uVar14 = this->rbuf_enq;
                  uVar13 = uVar13 + 1;
                } while (uVar10 < uVar14);
              }
              this->rbuf_enq = ~uVar12 + sVar7 + uVar14;
              bVar16 = false;
              bVar17 = 3;
              iVar15 = 0;
              goto LAB_00112dc8;
            }
LAB_00112dc1:
            bVar16 = true;
LAB_00112dc8:
            sVar3 = uVar12 + 1;
          } while (bVar16);
          if (uVar12 < uVar2) {
            return iVar15;
          }
        }
        iVar4 = read_characters(this,true);
        if (iVar4 < 0) {
          return iVar4;
        }
      } while (iVar4 != 0);
      bVar16 = false;
      iVar4 = gettimeofday((timeval *)local_50,(__timezone_ptr_t)0x0);
      if (iVar4 == 0) {
        bVar16 = (ulong)T_now.tv_sec / 1000 + (long)local_50 * 1000 < uVar8 + lVar6 + lVar9;
        if (!bVar16) {
          iVar15 = -1;
        }
      }
      else {
        iVar15 = -1;
      }
    } while (bVar16);
  }
  return iVar15;
}

Assistant:

int terminal_driver::cursor_position(size_t &x, size_t &y, ssize_t timeout_ms)
    {
        x = y = 0;

        //XXX: do not check for 'control_enabled' because this function is used to determine 'control_enabled'

        if (timeout_ms < 0)
            timeout_ms = LC_CURSOR_POSITION_READ_TIMEOUT_ms;

        int r = write("\x1b[6n", 4);
        if (r != 0)
            return r;

        struct timeval T_start = { 0, 0 };
        gettimeofday(&T_start, NULL);

        while (true) {
            // search for pattern: ^[yyy;xxxR  (minimum of 6 characters)
            if (rbuf_enq >= (rbuf_deq + 6)) {
                enum { WAIT_ESC0, WAIT_ESC1, WAIT_SEMI, WAIT_TERM } seq_state = WAIT_ESC0;
                size_t rbuf_mask = (rbuf_size - 1);
                size_t rbuf_search = rbuf_deq;
                size_t rbuf_found = rbuf_size;
                while (rbuf_search < rbuf_enq) {
                    uint8_t c = *(rbuf + (rbuf_search & rbuf_mask));
                    switch (seq_state) {
                    case WAIT_ESC0:
                        if (c == 0x1b) {
                            seq_state = WAIT_ESC1;
                            rbuf_found = rbuf_search;
                        }
                        break;
                    case WAIT_ESC1:
                        if (c == '[') {
                            seq_state = WAIT_SEMI;
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    case WAIT_SEMI:
                        if (c == ';') {
                            seq_state = WAIT_TERM;
                        }
                        else if (isdigit(c)) {
                            y = y*10 + (c-'0');
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    case WAIT_TERM:
                        if (c == 'R') {
                            // pattern found; remove bytes from buffer
                            ++rbuf_search;
                            size_t rbuf_copy_to = rbuf_found;
                            size_t rbuf_copy_from = rbuf_search;
                            while (rbuf_copy_from < rbuf_enq) {
                                *(rbuf + (rbuf_copy_to & rbuf_mask)) = *(rbuf + (rbuf_copy_from & rbuf_mask));
                                ++rbuf_copy_to;
                                ++rbuf_copy_from;
                            }
                            rbuf_enq -= (rbuf_search - rbuf_found);
                            return 0;
                        }
                        else if (isdigit(c)) {
                            x = x*10 + (c-'0');
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    }
                    ++rbuf_search;
                }
            }
            // pattern not found; need more characters
            r = read_characters(true);
            if (r < 0)
                return r;
            else if (r == 0) {
                // timeout logic
                struct timeval T_now;
                if (gettimeofday(&T_now, NULL) == 0) {
                    uint64_t t_msec_now = T_now.tv_sec * 1000ULL + T_now.tv_usec/1000ULL;
                    uint64_t t_msec_start = T_start.tv_sec * 1000ULL + T_start.tv_usec/1000ULL;
                    if (t_msec_now >= (t_msec_start + timeout_ms))
                        return -1;
                }
                else {
                    return -1;
                }
            }
        }
    }